

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor_rational.hpp
# Opt level: O2

void __thiscall soplex::CLUFactorRational::colSingletons(CLUFactorRational *this)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  int p_col;
  int iVar4;
  int *piVar5;
  int *piVar6;
  int *piVar7;
  int *piVar8;
  int *piVar9;
  int *piVar10;
  int *piVar11;
  int *piVar12;
  pointer pnVar13;
  long lVar14;
  int *piVar15;
  long lVar16;
  int *piVar17;
  long lVar18;
  long lVar19;
  int iVar20;
  int iVar21;
  int *piVar22;
  long lVar23;
  long lVar24;
  long lVar25;
  ulong uVar26;
  
  piVar5 = (this->row).orig;
  piVar6 = (this->row).perm;
  piVar7 = (this->temp).s_mark;
  lVar19 = 0;
  do {
    if ((this->temp).stage <= lVar19) {
      return;
    }
    iVar1 = piVar5[lVar19];
    piVar8 = (this->u).row.idx;
    iVar2 = (this->u).row.start[iVar1];
    uVar3 = (this->u).row.len[iVar1];
    if ((int)uVar3 < 1) {
      uVar3 = 0;
    }
    piVar17 = piVar8;
    for (uVar26 = 0; uVar26 != uVar3; uVar26 = uVar26 + 1) {
      p_col = piVar8[(long)iVar2 + uVar26];
      piVar9 = (this->u).col.idx;
      piVar10 = (this->u).col.start;
      piVar11 = (this->u).col.len;
      piVar12 = (this->temp).s_cact;
      iVar21 = (piVar11[p_col] + piVar10[p_col]) - piVar12[p_col];
      piVar15 = piVar9 + iVar21;
      do {
        piVar22 = piVar15;
        piVar15 = piVar22 + 1;
      } while (*piVar22 != iVar1);
      *piVar22 = piVar9[iVar21];
      piVar9[iVar21] = iVar1;
      iVar21 = piVar12[p_col];
      piVar12[p_col] = iVar21 + -1;
      if (iVar21 == 2) {
        iVar21 = piVar11[p_col];
        piVar11[p_col] = iVar21 + -1;
        iVar21 = piVar9[(long)piVar10[p_col] + (long)iVar21 + -1];
        if (-1 < piVar6[iVar21]) goto LAB_0019f456;
        piVar9 = (this->u).row.len;
        iVar20 = piVar9[iVar21] + -1;
        iVar4 = (this->u).row.start[iVar21];
        piVar9[iVar21] = iVar20;
        lVar18 = (long)(iVar4 + iVar20);
        lVar23 = lVar18 * 4 + 4;
        lVar16 = lVar18 * 0x40 + 0x40;
        do {
          lVar25 = lVar16;
          lVar24 = lVar23 + -4;
          lVar14 = lVar23 + -4;
          lVar23 = lVar24;
          lVar16 = lVar25 + -0x40;
        } while (*(int *)((long)piVar17 + lVar14) != p_col);
        setPivot(this,(this->temp).stage,p_col,iVar21,
                 (Rational *)
                 ((long)&(this->u).row.val.val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.m_value + lVar25));
        iVar21 = (this->temp).stage;
        (this->temp).stage = iVar21 + 1;
        piVar7[iVar21] = p_col;
        pnVar13 = (this->u).row.val.val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        boost::
        rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
        ::operator=((rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
                     *)((long)&pnVar13[-1].m_backend.m_value + lVar25),
                    (rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
                     *)(pnVar13 + lVar18));
        piVar17 = (this->u).row.idx;
        *(int *)((long)piVar17 + lVar24) = piVar17[lVar18];
      }
      else if (iVar21 == 1) {
LAB_0019f456:
        this->stat = SINGULAR;
        return;
      }
    }
    lVar19 = lVar19 + 1;
  } while( true );
}

Assistant:

inline void CLUFactorRational::colSingletons()
{
   int i, j, k, n;
   int len;
   int p_col, p_row, newrow;
   int* idx;
   int* rorig = row.orig;
   int* rperm = row.perm;
   int* sing = temp.s_mark;


   /*  Iteratively update column counts due to removed column singletons
    *  thereby removing new arising columns singletons
    *  and computing the index of the first row singleton (-1)
    *  until no more can be found.
    */

   for(i = 0; i < temp.stage; ++i)
   {
      p_row = rorig[i];
      assert(p_row >= 0);
      idx = &(u.row.idx[u.row.start[p_row]]);
      len = u.row.len[p_row];

      for(j = 0; j < len; ++j)
      {
         /*  Move pivotal nonzeros to front of column.
          */
         p_col = idx[j];
         assert(temp.s_cact[p_col] > 0);

         n = u.col.start[p_col] + u.col.len[p_col] - temp.s_cact[p_col];

         for(k = n; u.col.idx[k] != p_row; ++k)
            ;

         assert(k < u.col.start[p_col] + u.col.len[p_col]);

         u.col.idx[k] = u.col.idx[n];

         u.col.idx[n] = p_row;

         n = --(temp.s_cact[p_col]);          /* column nonzeros of ACTIVE matrix */

         if(n == 1)                   /* Here is another singleton */
         {
            newrow = u.col.idx[--u.col.len[p_col] + u.col.start[p_col]];

            /*      Ensure, matrix not singular
             */

            if(rperm[newrow] >= 0)
            {
               stat = SLinSolverRational::SINGULAR;
               return;
            }

            /*      Find singleton in row.
             */
            n = u.row.start[newrow] + (--(u.row.len[newrow]));

            for(k = n; u.row.idx[k] != p_col; --k)
               ;

            /*      Remove singleton from column.
             */
            setPivot(temp.stage, p_col, newrow, u.row.val[k]);

            sing[temp.stage++] = p_col;

            /*      Move pivot element to diag.
             */
            u.row.val[k] = u.row.val[n];

            u.row.idx[k] = u.row.idx[n];
         }
         else if(n == 0)
         {
            stat = SLinSolverRational::SINGULAR;
            return;
         }
      }
   }

   assert(temp.stage <= thedim);
}